

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

TriStateResult QFileSystemEngine::cloneFile(int srcfd,int dstfd,QFileSystemMetaData *knownData)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  TriStateResult TVar5;
  long in_FS_OFFSET;
  stat64 local_b0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((~(knownData->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x72a67077) == 0) {
    uVar1 = (knownData->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
    if ((uVar1 >> 0x11 & 1) == 0) {
      if ((uVar1 >> 0x12 & 1) == 0) goto LAB_001314ee;
      piVar4 = __errno_location();
      *piVar4 = 0x15;
      goto LAB_001315a6;
    }
  }
  else {
LAB_001314ee:
    memset(&local_b0,0xaa,0x90);
    iVar2 = fstat64(srcfd,&local_b0);
    if (iVar2 == -1) {
LAB_001315a6:
      TVar5 = Failed;
      goto LAB_001315c5;
    }
    TVar5 = NotSupported;
    if ((local_b0.st_mode & 0xf000) != 0x8000) goto LAB_001315c5;
  }
  iVar2 = ioctl(dstfd,0x40049409,srcfd);
  TVar5 = Success;
  if (iVar2 != 0) {
    lVar3 = sendfile(dstfd,srcfd,(off_t *)0x0,0x7ffff000);
    if (lVar3 == -1) {
      piVar4 = __errno_location();
      TVar5 = -(*piVar4 != 5 && *piVar4 != 0x1c);
    }
    else {
      do {
        if (lVar3 == 0) goto LAB_001315c5;
        lVar3 = sendfile(dstfd,srcfd,(off_t *)0x0,0x7ffff000);
      } while (lVar3 != -1);
      TVar5 = Failed;
      ftruncate(dstfd,0);
      lseek(srcfd,0,0);
      lseek(dstfd,0,0);
    }
  }
LAB_001315c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return TVar5;
  }
  __stack_chk_fail();
}

Assistant:

auto QFileSystemEngine::cloneFile(int srcfd, int dstfd, const QFileSystemMetaData &knownData) -> TriStateResult
{
    QT_STATBUF statBuffer;
    if (knownData.hasFlags(QFileSystemMetaData::PosixStatFlags) &&
            knownData.isFile()) {
        statBuffer.st_mode = S_IFREG;
    } else if (knownData.hasFlags(QFileSystemMetaData::PosixStatFlags) &&
               knownData.isDirectory()) {
        errno = EISDIR;
        return TriStateResult::Failed;   // fcopyfile(3) returns success on directories
    } else if (QT_FSTAT(srcfd, &statBuffer) == -1) {
        // errno was set
        return TriStateResult::Failed;
    } else if (!S_ISREG((statBuffer.st_mode))) {
        // not a regular file, let QFile do the copy
        return TriStateResult::NotSupported;
    }

    [[maybe_unused]] auto destinationIsEmpty = [dstfd]() {
        QT_STATBUF statBuffer;
        return QT_FSTAT(dstfd, &statBuffer) == 0 && statBuffer.st_size == 0;
    };
    Q_ASSERT(destinationIsEmpty());

#if defined(Q_OS_LINUX)
    // first, try FICLONE (only works on regular files and only on certain fs)
    if (::ioctl(dstfd, FICLONE, srcfd) == 0)
        return TriStateResult::Success;
#elif defined(Q_OS_DARWIN)
    // try fcopyfile
    if (fcopyfile(srcfd, dstfd, nullptr, COPYFILE_DATA | COPYFILE_STAT) == 0)
        return TriStateResult::Success;
    switch (errno) {
    case ENOTSUP:
    case ENOMEM:
        return TriStateResult::NotSupported;    // let QFile try
    }
    return TriStateResult::Failed;
#endif

#if QT_CONFIG(copy_file_range)
    // Second, try copy_file_range. Tested on Linux & FreeBSD: FreeBSD can copy
    // across mountpoints, Linux currently (6.12) can only if the source and
    // destination mountpoints are the same filesystem type.
    QT_OFF_T srcoffset = 0;
    QT_OFF_T dstoffset = 0;
    ssize_t copied;
    do {
        copied = ::copy_file_range(srcfd, &srcoffset, dstfd, &dstoffset, SSIZE_MAX, 0);
    } while (copied > 0 || (copied < 0 && errno == EINTR));
    if (copied == 0)
        return TriStateResult::Success;         // EOF -> success
    if (srcoffset) {
        // some bytes were copied, so this is a real error (like ENOSPC).
        copied = ftruncate(dstfd, 0);
        return TriStateResult::Failed;
    }
    if (errno != EXDEV)
        return TriStateResult::Failed;
#endif

#if defined(Q_OS_LINUX)
    // For Linux, try sendfile (it can send to some special types too).
    // sendfile(2) is limited in the kernel to 2G - 4k
    const size_t SendfileSize = 0x7ffff000;

    ssize_t n = ::sendfile(dstfd, srcfd, nullptr, SendfileSize);
    if (n == -1) {
        switch (errno) {
        case ENOSPC:
        case EIO:
            return TriStateResult::Failed;
        }

        // if we got an error here, give up and try at an upper layer
        return TriStateResult::NotSupported;
    }

    while (n) {
        n = ::sendfile(dstfd, srcfd, nullptr, SendfileSize);
        if (n == -1) {
            // uh oh, this is probably a real error (like ENOSPC)
            n = ftruncate(dstfd, 0);
            n = lseek(srcfd, 0, SEEK_SET);
            n = lseek(dstfd, 0, SEEK_SET);
            return TriStateResult::Failed;
        }
    }

    return TriStateResult::Success;
#else
    Q_UNUSED(dstfd);
    return TriStateResult::NotSupported;
#endif
}